

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolact.cpp
# Opt level: O0

void draw_objects(Mat *bgr,vector<Object,_std::allocator<Object>_> *objects)

{
  ulong uVar1;
  size_type sVar2;
  vector<Object,_std::allocator<Object>_> *in_RSI;
  int x_1;
  uchar *p;
  uchar *mp;
  int y_1;
  int y;
  int x;
  Size label_size;
  int baseLine;
  char text [256];
  uchar *color;
  Object *obj;
  size_t i;
  int color_index;
  Mat image;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  double in_stack_fffffffffffffc08;
  allocator *paVar3;
  double in_stack_fffffffffffffc10;
  vector *this;
  Rect_<float> *in_stack_fffffffffffffc18;
  undefined5 in_stack_fffffffffffffc20;
  uchar in_stack_fffffffffffffc25;
  uchar in_stack_fffffffffffffc26;
  uchar in_stack_fffffffffffffc27;
  _InputArray local_3a8;
  allocator local_389;
  string local_388 [32];
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  _InputArray local_348;
  allocator local_329;
  string local_328 [36];
  int local_304;
  uchar *local_300;
  uchar *local_2f8;
  int local_2ec;
  undefined1 local_2e8 [36];
  Point_<int> local_2c4;
  allocator local_2b9;
  string local_2b8 [32];
  undefined1 local_298 [24];
  undefined1 local_280 [32];
  Size_<int> local_260;
  Point_<int> local_258;
  Rect_<int> local_250;
  undefined1 local_240 [28];
  int local_224;
  int local_220;
  allocator local_219;
  string local_218 [36];
  int local_1f4;
  int local_1f0;
  int local_1ec;
  char local_1e8 [256];
  undefined1 local_e8 [36];
  undefined1 local_c4 [28];
  undefined1 local_a8 [24];
  uchar (*local_90) [3];
  const_reference local_88;
  ulong local_80;
  int local_74;
  Mat local_70 [8];
  int local_68;
  int local_64;
  vector<Object,_std::allocator<Object>_> *local_10;
  
  local_10 = in_RSI;
  cv::Mat::clone();
  local_74 = 0;
  for (local_80 = 0; uVar1 = local_80,
      sVar2 = std::vector<Object,_std::allocator<Object>_>::size(local_10), uVar1 < sVar2;
      local_80 = local_80 + 1) {
    local_88 = std::vector<Object,_std::allocator<Object>_>::operator[](local_10,local_80);
    if (0.15 <= local_88->prob) {
      fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",SUB84((double)local_88->prob,0),
              (double)(local_88->rect).x,(double)(local_88->rect).y,(double)(local_88->rect).width,
              (double)(local_88->rect).height,(ulong)(uint)local_88->label);
      local_90 = draw_objects::colors + local_74 % 0x51;
      local_74 = local_74 + 1;
      cv::_InputOutputArray::_InputOutputArray
                ((_InputOutputArray *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (Mat *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      cv::Rect_::operator_cast_to_Rect_(in_stack_fffffffffffffc18);
      cv::Scalar_<double>::Scalar_
                ((Scalar_<double> *)
                 CONCAT17(in_stack_fffffffffffffc27,
                          CONCAT16(in_stack_fffffffffffffc26,
                                   CONCAT15(in_stack_fffffffffffffc25,in_stack_fffffffffffffc20))),
                 (double)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                 in_stack_fffffffffffffc08,
                 (double)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      cv::rectangle(local_a8,local_c4,local_e8,1,8,0);
      cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x128769);
      sprintf(local_1e8,"%s %.1f%%",SUB84((double)(local_88->prob * 100.0),0),
              draw_objects::class_names[local_88->label]);
      local_1ec = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,local_1e8,&local_219);
      cv::getTextSize((string *)&local_1f4,(int)local_218,0.5,0,(int *)0x1);
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      local_220 = (int)(local_88->rect).x;
      local_224 = (int)(((local_88->rect).y - (float)local_1f0) - (float)local_1ec);
      if (local_224 < 0) {
        local_224 = 0;
      }
      if (local_64 < local_220 + local_1f4) {
        local_220 = local_64 - local_1f4;
      }
      cv::_InputOutputArray::_InputOutputArray
                ((_InputOutputArray *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (Mat *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      cv::Point_<int>::Point_(&local_258,local_220,local_224);
      cv::Size_<int>::Size_(&local_260,local_1f4,local_1f0 + local_1ec);
      cv::Rect_<int>::Rect_(&local_250,&local_258,&local_260);
      cv::Scalar_<double>::Scalar_
                ((Scalar_<double> *)
                 CONCAT17(in_stack_fffffffffffffc27,
                          CONCAT16(in_stack_fffffffffffffc26,
                                   CONCAT15(in_stack_fffffffffffffc25,in_stack_fffffffffffffc20))),
                 (double)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                 in_stack_fffffffffffffc08,
                 (double)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      cv::rectangle(local_240,&local_250,local_280,0xffffffff,8,0);
      cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x128a18);
      cv::_InputOutputArray::_InputOutputArray
                ((_InputOutputArray *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (Mat *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b8,local_1e8,&local_2b9);
      cv::Point_<int>::Point_(&local_2c4,local_220,local_224 + local_1f0);
      cv::Scalar_<double>::Scalar_
                ((Scalar_<double> *)
                 CONCAT17(in_stack_fffffffffffffc27,
                          CONCAT16(in_stack_fffffffffffffc26,
                                   CONCAT15(in_stack_fffffffffffffc25,in_stack_fffffffffffffc20))),
                 (double)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                 in_stack_fffffffffffffc08,
                 (double)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      in_stack_fffffffffffffc00 = 0;
      in_stack_fffffffffffffbf8 = 8;
      cv::putText(0,local_298,local_2b8,&local_2c4,0,local_2e8);
      std::__cxx11::string::~string(local_2b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x128b0c);
      for (local_2ec = 0; local_2ec < local_68; local_2ec = local_2ec + 1) {
        local_2f8 = cv::Mat::ptr(&local_88->mask,local_2ec);
        local_300 = cv::Mat::ptr(local_70,local_2ec);
        for (local_304 = 0; local_304 < local_64; local_304 = local_304 + 1) {
          if (local_2f8[local_304] == 0xff) {
            in_stack_fffffffffffffc27 =
                 cv::saturate_cast<unsigned_char>
                           ((double)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
            *local_300 = in_stack_fffffffffffffc27;
            in_stack_fffffffffffffc26 =
                 cv::saturate_cast<unsigned_char>
                           ((double)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
            local_300[1] = in_stack_fffffffffffffc26;
            in_stack_fffffffffffffc25 =
                 cv::saturate_cast<unsigned_char>
                           ((double)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
            local_300[2] = in_stack_fffffffffffffc25;
          }
          local_300 = local_300 + 3;
        }
      }
    }
  }
  paVar3 = &local_329;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"result.png",paVar3);
  cv::_InputArray::_InputArray
            ((_InputArray *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
             (Mat *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  local_368 = 0;
  uStack_360 = 0;
  local_358 = 0;
  this = (vector *)&local_368;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x128dec);
  cv::imwrite(local_328,&local_348,this);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  cv::_InputArray::~_InputArray(&local_348);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  paVar3 = &local_389;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"image",paVar3);
  cv::_InputArray::_InputArray
            ((_InputArray *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
             (Mat *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  cv::imshow(local_388,&local_3a8);
  cv::_InputArray::~_InputArray(&local_3a8);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  cv::waitKey(0);
  cv::Mat::~Mat(local_70);
  return;
}

Assistant:

static void draw_objects(const cv::Mat& bgr, const std::vector<Object>& objects)
{
    static const char* class_names[] = {"background",
                                        "person", "bicycle", "car", "motorcycle", "airplane", "bus",
                                        "train", "truck", "boat", "traffic light", "fire hydrant",
                                        "stop sign", "parking meter", "bench", "bird", "cat", "dog",
                                        "horse", "sheep", "cow", "elephant", "bear", "zebra", "giraffe",
                                        "backpack", "umbrella", "handbag", "tie", "suitcase", "frisbee",
                                        "skis", "snowboard", "sports ball", "kite", "baseball bat",
                                        "baseball glove", "skateboard", "surfboard", "tennis racket",
                                        "bottle", "wine glass", "cup", "fork", "knife", "spoon", "bowl",
                                        "banana", "apple", "sandwich", "orange", "broccoli", "carrot",
                                        "hot dog", "pizza", "donut", "cake", "chair", "couch",
                                        "potted plant", "bed", "dining table", "toilet", "tv", "laptop",
                                        "mouse", "remote", "keyboard", "cell phone", "microwave", "oven",
                                        "toaster", "sink", "refrigerator", "book", "clock", "vase",
                                        "scissors", "teddy bear", "hair drier", "toothbrush"
                                       };

    static const unsigned char colors[81][3] = {
        {56, 0, 255},
        {226, 255, 0},
        {0, 94, 255},
        {0, 37, 255},
        {0, 255, 94},
        {255, 226, 0},
        {0, 18, 255},
        {255, 151, 0},
        {170, 0, 255},
        {0, 255, 56},
        {255, 0, 75},
        {0, 75, 255},
        {0, 255, 169},
        {255, 0, 207},
        {75, 255, 0},
        {207, 0, 255},
        {37, 0, 255},
        {0, 207, 255},
        {94, 0, 255},
        {0, 255, 113},
        {255, 18, 0},
        {255, 0, 56},
        {18, 0, 255},
        {0, 255, 226},
        {170, 255, 0},
        {255, 0, 245},
        {151, 255, 0},
        {132, 255, 0},
        {75, 0, 255},
        {151, 0, 255},
        {0, 151, 255},
        {132, 0, 255},
        {0, 255, 245},
        {255, 132, 0},
        {226, 0, 255},
        {255, 37, 0},
        {207, 255, 0},
        {0, 255, 207},
        {94, 255, 0},
        {0, 226, 255},
        {56, 255, 0},
        {255, 94, 0},
        {255, 113, 0},
        {0, 132, 255},
        {255, 0, 132},
        {255, 170, 0},
        {255, 0, 188},
        {113, 255, 0},
        {245, 0, 255},
        {113, 0, 255},
        {255, 188, 0},
        {0, 113, 255},
        {255, 0, 0},
        {0, 56, 255},
        {255, 0, 113},
        {0, 255, 188},
        {255, 0, 94},
        {255, 0, 18},
        {18, 255, 0},
        {0, 255, 132},
        {0, 188, 255},
        {0, 245, 255},
        {0, 169, 255},
        {37, 255, 0},
        {255, 0, 151},
        {188, 0, 255},
        {0, 255, 37},
        {0, 255, 0},
        {255, 0, 170},
        {255, 0, 37},
        {255, 75, 0},
        {0, 0, 255},
        {255, 207, 0},
        {255, 0, 226},
        {255, 245, 0},
        {188, 255, 0},
        {0, 255, 18},
        {0, 255, 75},
        {0, 255, 151},
        {255, 56, 0},
        {245, 255, 0}
    };

    cv::Mat image = bgr.clone();

    int color_index = 0;

    for (size_t i = 0; i < objects.size(); i++)
    {
        const Object& obj = objects[i];

        if (obj.prob < 0.15)
            continue;

        fprintf(stderr, "%d = %.5f at %.2f %.2f %.2f x %.2f\n", obj.label, obj.prob,
                obj.rect.x, obj.rect.y, obj.rect.width, obj.rect.height);

        const unsigned char* color = colors[color_index % 81];
        color_index++;

        cv::rectangle(image, obj.rect, cv::Scalar(color[0], color[1], color[2]));

        char text[256];
        sprintf(text, "%s %.1f%%", class_names[obj.label], obj.prob * 100);

        int baseLine = 0;
        cv::Size label_size = cv::getTextSize(text, cv::FONT_HERSHEY_SIMPLEX, 0.5, 1, &baseLine);

        int x = obj.rect.x;
        int y = obj.rect.y - label_size.height - baseLine;
        if (y < 0)
            y = 0;
        if (x + label_size.width > image.cols)
            x = image.cols - label_size.width;

        cv::rectangle(image, cv::Rect(cv::Point(x, y), cv::Size(label_size.width, label_size.height + baseLine)),
                      cv::Scalar(255, 255, 255), -1);

        cv::putText(image, text, cv::Point(x, y + label_size.height),
                    cv::FONT_HERSHEY_SIMPLEX, 0.5, cv::Scalar(0, 0, 0));

        // draw mask
        for (int y = 0; y < image.rows; y++)
        {
            const uchar* mp = obj.mask.ptr(y);
            uchar* p = image.ptr(y);
            for (int x = 0; x < image.cols; x++)
            {
                if (mp[x] == 255)
                {
                    p[0] = cv::saturate_cast<uchar>(p[0] * 0.5 + color[0] * 0.5);
                    p[1] = cv::saturate_cast<uchar>(p[1] * 0.5 + color[1] * 0.5);
                    p[2] = cv::saturate_cast<uchar>(p[2] * 0.5 + color[2] * 0.5);
                }
                p += 3;
            }
        }
    }

    cv::imwrite("result.png", image);
    cv::imshow("image", image);
    cv::waitKey(0);
}